

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.c
# Opt level: O0

void pnga_gop(Integer type,void *x,Integer n,char *op)

{
  Integer n_00;
  char *in_RCX;
  Integer in_RDX;
  double *in_RSI;
  undefined8 in_RDI;
  Integer p_grp;
  Integer in_stack_00000168;
  char *in_stack_00000170;
  char *in_stack_ffffffffffffffd0;
  int n_01;
  
  n_00 = pnga_pgroup_get_default();
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (n_00 < 1) {
    n_01 = (int)((ulong)in_RDX >> 0x20);
    switch(in_RDI) {
    case 0x3e9:
      armci_msg_igop((int *)in_RSI,n_01,in_RCX);
      break;
    case 0x3ea:
      armci_msg_lgop((long *)in_RSI,n_01,in_RCX);
      break;
    case 0x3eb:
      armci_msg_fgop((float *)in_RSI,n_01,in_RCX);
      break;
    case 0x3ec:
      armci_msg_dgop(in_RSI,n_01,in_RCX);
      break;
    default:
      pnga_error(in_stack_00000170,in_stack_00000168);
      break;
    case 0x3ee:
      armci_msg_fgop((float *)in_RSI,n_01,in_RCX);
      break;
    case 0x3ef:
      armci_msg_dgop(in_RSI,n_01,in_RCX);
      break;
    case 0x3f8:
      armci_msg_llgop((longlong *)in_RSI,n_01,in_RCX);
    }
  }
  else {
    pnga_pgroup_gop((Integer)in_RSI,in_RDX,in_RCX,n_00,in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void pnga_gop(Integer type, void *x, Integer n, char *op)
{
    Integer p_grp = pnga_pgroup_get_default();

    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if (p_grp > 0) {
        pnga_pgroup_gop(p_grp, type, x, n, op);
    } else {
#if defined(MSG_COMMS_MPI)
        switch (type){
            case C_INT:
                armci_msg_igop((int*)x, n, op);
                break;
            case C_LONG:
                armci_msg_lgop((long*)x, n, op);
                break;
            case C_LONGLONG:
                armci_msg_llgop((long long*)x, n, op);
                break;
            case C_FLOAT:
                armci_msg_fgop((float*)x, n, op);
                break;
            case C_DBL:
                armci_msg_dgop((double*)x, n, op);
                break;
            case C_SCPL:
                armci_msg_fgop((float*)x, 2*n, op);
                break;
            case C_DCPL:
                armci_msg_dgop((double*)x, 2*n, op);
                break;
            default:
                pnga_error(" wrong data type ",type);
        }
#else
        switch (type){
            case C_INT:
                pnga_error("Operation not defined for system",0);
                break;
            case C_LONG:
                tcg_igop(GA_TYPE_GOP, x, n, op);
                break;
            case C_LONGLONG:
                pnga_error("Operation not defined for system",0);
                break;
            case C_FLOAT:
                pnga_error("Operation not defined for system",0);
                break;
            case C_DBL:
                tcg_dgop(GA_TYPE_GOP, x, n, op);
                break;
            case C_SCPL:
                pnga_error("Operation not defined for system",0);
                break;
            case C_DCPL:
                pnga_error("Operation not defined for system",0);
                break;
            default:
                pnga_error(" wrong data type ",type);
        }
#endif
    }
}